

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe_utils.cpp
# Opt level: O3

string * PEGetPDBPath_abi_cxx11_(string *__return_storage_ptr__,void *data,size_t size)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  size_t sVar6;
  long lVar7;
  char *pcVar8;
  char *__s;
  long lVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  
  if (((0x3f < size) && (*data == 0x5a4d)) &&
     (lVar9 = (long)*(int *)((long)data + 0x3c), *(int *)((long)data + lVar9) == 0x4550)) {
    uVar2 = *(uint *)((long)data + lVar9 + 0xbc);
    if ((uVar2 != 0) && (uVar1 = *(ushort *)((long)data + lVar9 + 6), uVar1 != 0)) {
      lVar7 = (long)data + (ulong)*(ushort *)((long)data + lVar9 + 0x14) + lVar9 + 0x18;
      uVar3 = *(uint *)((long)data + lVar9 + 0xb8);
      uVar10 = 0;
      do {
        uVar4 = *(uint *)(lVar7 + 0xc);
        if (((uVar4 <= uVar3) && (uVar2 + uVar3 <= *(int *)(lVar7 + 0x10) + uVar4)) &&
           (0x1b < uVar2)) {
          lVar5 = (ulong)*(uint *)(lVar7 + 0x14) - (ulong)uVar4;
          lVar9 = ((ulong)*(uint *)(lVar7 + 0x14) - (ulong)uVar4) + (ulong)uVar3 + 0x14;
          lVar11 = 0;
          do {
            if ((*(int *)((long)data + lVar11 + lVar9 + -8) == 2) &&
               (uVar12 = (ulong)*(uint *)((long)data + lVar11 + lVar9),
               *(int *)((long)data + uVar12 + lVar5) == 0x53445352)) {
              lVar5 = uVar12 + lVar5;
              __s = (char *)((long)data + lVar5 + 0x18);
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2
              ;
              sVar6 = strlen(__s);
              pcVar8 = (char *)((long)data + sVar6 + lVar5 + 0x18);
              goto LAB_0010dc0e;
            }
            lVar11 = lVar11 + 0x1c;
          } while (((ulong)(uVar2 >> 2) / 7) * 0x1c != lVar11);
        }
        uVar10 = uVar10 + 1;
        lVar7 = lVar7 + 0x28;
      } while (uVar10 != uVar1);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar8 = "";
  __s = "";
LAB_0010dc0e:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,__s,pcVar8);
  return __return_storage_ptr__;
}

Assistant:

std::string PEGetPDBPath(const void* data, size_t size)
{
    if (!PEIsValidFile(data, size))
        return "";

    const PE_IMAGE_DOS_HEADER* dosHeader = (const PE_IMAGE_DOS_HEADER*)data;
    const PE_IMAGE_NT_HEADERS* ntHeader = (PE_IMAGE_NT_HEADERS*)((const uint8_t*)data + dosHeader->ntHeader);

    const PE_IMAGE_DATA_DIRECTORY& debugDir = ntHeader->OptionalHeader.DataDirectory[IMAGE_DIRECTORY_ENTRY_DEBUG];
    if (debugDir.size == 0)
        return "";

    // find which section that is in
    const PE_IMAGE_SECTION_HEADER* section = IMAGE_FIRST_SECTION_IMPL(ntHeader);
    for (int i = 0; i < ntHeader->FileHeader.numberOfSections; ++i, ++section)
    {
        if ((debugDir.va < section->VirtualAddress) || (debugDir.va + debugDir.size > section->VirtualAddress + section->SizeOfRawData))
            continue; // not in this section

        const char* sectionBasePtr = (const char*)data + section->PointerToRawData - section->VirtualAddress;
        const PE_IMAGE_DEBUG_DIRECTORY* entries = (PE_IMAGE_DEBUG_DIRECTORY*)(sectionBasePtr + debugDir.va);
        size_t entryCount = debugDir.size / sizeof(PE_IMAGE_DEBUG_DIRECTORY);
        for (int ei = 0; ei < entryCount; ++ei)
        {
            if (entries[ei].Type == PE_IMAGE_DEBUG_TYPE_CODEVIEW)
            {
                const PE_DEBUGTYPE_CODEVIEW* info = (const PE_DEBUGTYPE_CODEVIEW*)(sectionBasePtr + entries[ei].AddressOfRawData);
                if (memcmp(&info->Signature, "RSDS", 4) == 0)
                {
                    return info->PdbFileName;
                }
            }
        }
    }

    return "";
}